

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives_lib.cpp
# Opt level: O3

void skiwi::assign_primitive_addresses(primitive_map *pm,first_pass_data *d,uint64_t address_start)

{
  const_iterator cVar1;
  _Base_ptr p_Var2;
  runtime_error *this;
  _Rb_tree_header *p_Var3;
  
  p_Var2 = (pm->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(pm->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      cVar1 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ::find(&(d->label_to_address)._M_t,(key_type *)(p_Var2 + 2));
      if ((_Rb_tree_header *)cVar1._M_node ==
          &(d->label_to_address)._M_t._M_impl.super__Rb_tree_header) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Error during primitives library generation");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      *(uint64_t *)(p_Var2 + 3) = *(long *)(cVar1._M_node + 2) + address_start;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return;
}

Assistant:

void assign_primitive_addresses(primitive_map& pm, const ASM::first_pass_data& d, uint64_t address_start)
  {
  for (auto& pe : pm)
    {
    auto it = d.label_to_address.find(pe.second.label_name);
    if (it == d.label_to_address.end())
      throw std::runtime_error("Error during primitives library generation");
    pe.second.address = address_start + it->second;
    }
  }